

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O2

errr borg_keypress(keycode_t k)

{
  short sVar1;
  errr eVar2;
  char *what;
  long lVar3;
  
  if (k == 0) {
    borg_note(" & Key * *BAD KEY * *");
    eVar2 = -1;
  }
  else {
    if (*borg_cfg != 0) {
      if (k - 0x20 < 0x5f) {
        what = format("& Key <%c> (0x%02X)",k,k);
      }
      else {
        what = format("& Key <0x%02X>",k);
      }
      borg_note(what);
    }
    lVar3 = (long)borg_key_head;
    sVar1 = borg_key_head + 1;
    borg_key_head = sVar1;
    borg_key_queue[lVar3] = k;
    if (sVar1 == 0x2000) {
      borg_key_head = 0;
      sVar1 = 0;
    }
    if (sVar1 == borg_key_tail) {
      borg_oops("overflow");
    }
    eVar2 = 0;
    if (borg_key_tail == 0x2000) {
      borg_key_tail = 0;
    }
  }
  return eVar2;
}

Assistant:

errr borg_keypress(keycode_t k)
{
    /* Hack -- Refuse to enqueue "nul" */
    if (!k) {
        borg_note(" & Key * *BAD KEY * *");
        return (-1);
    }

    /* Hack -- note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (k >= 32 && k <= 126) {
            borg_note(format("& Key <%c> (0x%02X)", k, k));
        } else {
            borg_note(format("& Key <0x%02X>", k));
        }
    }

    /* Store the char, advance the queue */
    borg_key_queue[borg_key_head++] = k;

    /* Circular queue, handle wrap */
    if (borg_key_head == KEY_SIZE)
        borg_key_head = 0;

    /* Hack -- Catch overflow (forget oldest) */
    if (borg_key_head == borg_key_tail)
        borg_oops("overflow");

    /* Hack -- Overflow may induce circular queue */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Success */
    return (0);
}